

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr-writer.h
# Opt level: O2

void __thiscall
mp::ExprWriter<mp::internal::ExprTypes,mp::GenericVarNamer>::
WriteFunc<mp::BasicIteratedExpr<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>,(mp::expr::Kind)68,(mp::expr::Kind)69>>
          (ExprWriter<mp::internal::ExprTypes,mp::GenericVarNamer> *this,
          BasicIteratedExpr<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_(mp::expr::Kind)68,_(mp::expr::Kind)69>
          e)

{
  BasicWriter<char> *this_00;
  char *__s;
  size_t sVar1;
  BasicStringRef<char> value;
  
  this_00 = *(BasicWriter<char> **)(this + 8);
  __s = internal::ExprInfo::INFO
        [*(uint *)e.super_BasicExpr<(mp::expr::Kind)68,_(mp::expr::Kind)69>.super_ExprBase.impl_].
        str;
  sVar1 = strlen(__s);
  value.size_ = sVar1;
  value.data_ = __s;
  fmt::BasicWriter<char>::operator<<(this_00,value);
  WriteArgs<mp::BasicIteratedExpr<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>,(mp::expr::Kind)68,(mp::expr::Kind)69>>
            (this,e,", ",0);
  return;
}

Assistant:

void WriteFunc(Expr e) {
    writer_ << str(e.kind());
    WriteArgs(e);
  }